

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  double dVar1;
  vec3 lookfrom;
  vec3 lookat;
  int iVar2;
  ostream *poVar3;
  int iVar4;
  hittable_list world;
  ray r;
  camera cam;
  undefined1 local_261;
  int local_260;
  int local_25c;
  undefined1 local_258 [16];
  double local_248;
  shared_ptr<hittable> local_238;
  double local_220;
  double local_218;
  double local_210;
  int local_204 [3];
  vec3 local_1f8;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  vec3 local_178;
  hittable local_158;
  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> local_150;
  ray local_138;
  camera local_f8;
  
  cornell_box_plus();
  local_178.e[2] = 0.0;
  local_178.e[0] = 0.0;
  local_178.e[1] = 0.0;
  local_258._0_4_ = 0xd5;
  local_1f8.e[0]._0_4_ = 0x157;
  local_204[2] = 0xe3;
  local_204[1] = 0x14c;
  local_204[0] = 0x22a;
  local_138.orig.e[0] = 0.0;
  local_138.orig.e[1] = 0.0;
  local_f8.origin.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<xz_rect,std::allocator<xz_rect>,int,int,int,int,int,std::shared_ptr<material>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8.origin.e + 1),
             (xz_rect **)&local_f8,(allocator<xz_rect> *)&local_261,(int *)local_258,
             (int *)&local_1f8,local_204 + 2,local_204 + 1,local_204,
             (shared_ptr<material> *)&local_138);
  local_238.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_f8.origin.e[0];
  local_238.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.origin.e[1];
  local_f8.origin.e[0] = 0.0;
  local_f8.origin.e[1] = 0.0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138.orig.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138.orig.e[1]);
  }
  local_198 = 0x4071600000000000;
  uStack_190 = 0x4071600000000000;
  local_188 = 0xc089000000000000;
  local_1b8 = 0x4071600000000000;
  uStack_1b0 = 0x4071600000000000;
  local_1a8 = 0;
  local_1d8 = 0;
  uStack_1d4 = 0;
  uStack_1d0 = 0;
  uStack_1cc = 0x3ff00000;
  local_1c8 = 0;
  lookfrom.e[1] = 278.0;
  lookfrom.e[0] = 278.0;
  lookfrom.e[2] = -800.0;
  lookat.e[1] = 278.0;
  lookat.e[0] = 278.0;
  lookat.e[2] = 0.0;
  camera::camera(&local_f8,lookfrom,lookat,(vec3)(ZEXT824(0x3ff0000000000000) << 0x40),40.0,2.0,1.0,
                 10.0,0.0,1.0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P3\n",3);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,200);
  local_138.orig.e[0] = (double)CONCAT71(local_138.orig.e[0]._1_7_,0x20);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_138,1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,100);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n255\n",5);
  iVar4 = 99;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\rScanlines remaining: ",0x16);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar4);
    local_138.orig.e[0] = (double)CONCAT71(local_138.orig.e[0]._1_7_,0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_138,1);
    std::ostream::flush();
    local_220 = (double)iVar4;
    iVar2 = 0;
    local_260 = iVar4;
    do {
      local_218 = (double)iVar2;
      local_258 = ZEXT816(0);
      local_248 = 0.0;
      iVar4 = 100;
      local_25c = iVar2;
      do {
        iVar2 = rand();
        local_210 = ((double)iVar2 * 4.656612873077393e-10 + local_218) / 200.0;
        iVar2 = rand();
        camera::get_ray(&local_138,&local_f8,local_210,
                        ((double)iVar2 * 4.656612873077393e-10 + local_220) / 100.0);
        ray_color(&local_1f8,&local_138,&local_178,&local_158,&local_238,0x32);
        dVar1 = local_1f8.e[1] + (double)local_258._8_8_;
        local_258._8_4_ = SUB84(dVar1,0);
        local_258._0_8_ =
             (double)CONCAT44(local_1f8.e[0]._4_4_,local_1f8.e[0]._0_4_) + (double)local_258._0_8_;
        local_258._12_4_ = (int)((ulong)dVar1 >> 0x20);
        local_248 = local_1f8.e[2] + local_248;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      vec3::write_color((vec3 *)local_258,(ostream *)&std::cout,100);
      iVar2 = local_25c + 1;
    } while (iVar2 != 200);
    iVar4 = local_260 + -1;
  } while (local_260 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\nDone.\n",7);
  if (local_238.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_238.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  local_158._vptr_hittable = (_func_int **)&PTR_hit_0012e0f0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::~vector
            (&local_150);
  return 0;
}

Assistant:

int main() {

    // Image
    const int image_width = 200;
    const int image_height = 100;
    const int samples_per_pixel = 100;
    const int max_depth = 50;
    const auto aspect_ratio = double(image_width) / image_height;

    // World
    //auto world = random_scene();
    //auto world = two_spheres();
    //auto world = two_perlin_spheres();
    //auto world = earth();
    //auto world = simple_light();
    //auto world = cornell_box();
    //auto world = cornell_smoke();
    //auto world = final_scene();
    auto world = cornell_box_plus();

    const vec3 background(0, 0, 0);
    shared_ptr<hittable> lights =
            make_shared<xz_rect>(213, 343, 227, 332, 554, shared_ptr<material>());

    // Camera
    vec3 lookfrom(278, 278, -800);
    vec3 lookat(278, 278, 0);
    vec3 vup(0, 1, 0);
    auto dist_to_focus = 10.0;
    auto aperture = 1.0;
    auto vfov = 40.0;
    auto time0 = 0.0;
    auto time1 = 1.0;

    camera cam(lookfrom, lookat, vup, vfov, aspect_ratio, aperture, dist_to_focus, time0, time1);

    // Render
    std::cout << "P3\n" << image_width << ' ' << image_height << "\n255\n";

    for (int j = image_height - 1; j >= 0; --j) {
        std::cerr << "\rScanlines remaining: " << j << ' ' << std::flush;
        for (int i = 0; i < image_width; ++i) {
            vec3 color(0,0,0);
            for (int s = 0; s < samples_per_pixel; ++s) {
                auto u = (i + random_double()) / image_width;
                auto v = (j + random_double()) / image_height;
                ray r = cam.get_ray(u,v);
                color += ray_color(r, background, world, lights, max_depth);
            }
            color.write_color(std::cout,samples_per_pixel);
        }
    }

    std::cerr << "\nDone.\n";
}